

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2LoadImm12(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint16_t *Decoder_01;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  uint uVar4;
  
  uVar3 = Insn >> 0x10 & 0xf;
  if (uVar3 == 0xf) {
    uVar3 = MCInst_getOpcode(Inst);
    Decoder_00 = (void *)(ulong)uVar3;
    if ((int)uVar3 < 0x96c) {
      if (uVar3 == 0x94d) {
        uVar4 = 0x94f;
      }
      else if (uVar3 == 0x95c) {
        uVar4 = 0x95e;
      }
      else {
        if (uVar3 != 0x964) {
          return MCDisassembler_Fail;
        }
        uVar4 = 0x966;
      }
    }
    else if ((int)uVar3 < 0x9b7) {
      if (uVar3 == 0x96c) {
        uVar4 = 0x96e;
      }
      else {
        uVar4 = 0x976;
        if (uVar3 != 0x974) {
          return MCDisassembler_Fail;
        }
      }
    }
    else if (uVar3 == 0x9b7) {
      uVar4 = 0x9b9;
    }
    else {
      if (uVar3 != 0x9bb) {
        return MCDisassembler_Fail;
      }
      uVar4 = 0x9bd;
    }
    MCInst_setOpcode(Inst,uVar4);
    DVar2 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder_00);
    return DVar2;
  }
  uVar4 = Insn >> 0xc & 0xf;
  if (uVar4 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x95c) {
      uVar1 = 0x9b4;
    }
    else {
      if (uVar1 == 0x96c) {
        return MCDisassembler_Fail;
      }
      if (uVar1 != 0x964) goto LAB_001d6de3;
      uVar1 = 0x9bb;
    }
    MCInst_setOpcode(Inst,uVar1);
  }
LAB_001d6de3:
  uVar1 = MCInst_getOpcode(Inst);
  if ((7 < uVar1 - 0x9b4) ||
     (Decoder_01 = (uint16_t *)0x89, Address_00 = extraout_RDX,
     (0x89U >> (uVar1 - 0x9b4 & 0x1f) & 1) == 0)) {
    Decoder_01 = GPRDecoderTable;
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
    Address_00 = extraout_RDX_00;
  }
  DVar2 = DecodeT2AddrModeImm12(Inst,uVar3 << 0xd | Insn & 0xfff,Address_00,Decoder_01);
  if (MCDisassembler_Success < DVar2) {
    return MCDisassembler_Fail;
  }
  return *(DecodeStatus *)(&DAT_0033c3e0 + (ulong)DVar2 * 4);
}

Assistant:

static DecodeStatus DecodeT2LoadImm12(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (Rn << 13);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi12:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2PLDi12:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi12:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi12:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2PLDWi12);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2PLIi12);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi12:
			break;
		case ARM_t2PLIi12:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi12:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm12(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}